

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::received_synack(session_impl *this,bool ipv6)

{
  undefined7 in_register_00000031;
  int64_t value;
  
  value = 0x28;
  if ((int)CONCAT71(in_register_00000031,ipv6) != 0) {
    value = 0x3c;
  }
  counters::inc_stats_counter(&this->m_stats_counters,0x81,value);
  counters::inc_stats_counter(&this->m_stats_counters,0x85,value);
  stat::received_synack(&this->m_stat,ipv6);
  return;
}

Assistant:

void session_impl::received_synack(bool ipv6)
	{
		int const overhead = ipv6 ? 60 : 40;
		m_stats_counters.inc_stats_counter(counters::sent_ip_overhead_bytes
			, overhead);
		m_stats_counters.inc_stats_counter(counters::recv_ip_overhead_bytes
			, overhead);

		m_stat.received_synack(ipv6);
	}